

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O3

void __thiscall
anurbs::RTree<2L>::sort
          (RTree<2L> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,Index left,
          Index right)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  pointer plVar5;
  long lVar6;
  pointer pMVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  pointer puVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  unsigned_long __tmp;
  long lVar17;
  long lVar18;
  double tmp [2];
  
  if (left < right) {
    do {
      puVar12 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)puVar12 + (left + right & 0xfffffffffffffffeU) * 4);
      lVar11 = left + -1;
      lVar15 = right + 1;
      while( true ) {
        lVar14 = lVar11 * 8;
        do {
          lVar13 = lVar14;
          lVar11 = lVar11 + 1;
          uVar4 = *(ulong *)((long)puVar12 + lVar13 + 8);
          lVar14 = lVar13 + 8;
        } while (uVar4 < uVar3);
        lVar6 = lVar15 << 4;
        lVar18 = lVar15 + 1;
        do {
          lVar17 = lVar18;
          lVar16 = lVar6;
          lVar18 = lVar17 + -1;
          lVar6 = lVar16 + -0x10;
        } while (uVar3 < puVar12[lVar17 + -2]);
        lVar15 = lVar17 + -2;
        if (lVar15 <= lVar11) break;
        *(unsigned_long *)((long)puVar12 + lVar14) = puVar12[lVar17 + -2];
        puVar12[lVar17 + -2] = uVar4;
        plVar5 = (this->m_indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = *(long *)((long)plVar5 + lVar14);
        *(long *)((long)plVar5 + lVar14) = plVar5[lVar17 + -2];
        plVar5[lVar17 + -2] = lVar6;
        pMVar7 = (this->m_boxes_min).
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)
                 ((long)&pMVar7[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar13 * 2);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&pMVar7[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar16);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&pMVar7[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar13 * 2);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)
                 ((long)&pMVar7[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar16);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        pMVar7 = (this->m_boxes_max).
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)
                 ((long)&pMVar7[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar13 * 2);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&pMVar7[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar16);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&pMVar7[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar13 * 2);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar1 = (undefined8 *)
                 ((long)&pMVar7[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data + lVar16);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar12 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      sort(this,values,left,lVar17 + -2);
      left = lVar18;
    } while (lVar18 < right);
  }
  return;
}

Assistant:

void sort(std::vector<size_t>& values, const Index left, const Index right)
    {
        if (left >= right) {
            return;
        }

        const size_t pivot = values[(left + right) >> 1];

        Index i = left - 1;
        Index j = right + 1;

        while (true) {
            do {
                i += 1;
            } while(values[i] < pivot);

            do {
                j -= 1;
            } while(values[j] > pivot);

            if (i >= j) {
                break;
            }

            swap(values, i, j);
        }

        sort(values, left, j);
        sort(values, j + 1, right);
    }